

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSGetNumJtimesEvals(void *arkode_mem,long *njvevals)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSGetNumJtimesEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *njvevals = local_18->njtimes;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumJtimesEvals(void *arkode_mem, long int *njvevals)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; set output value and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSGetNumJtimesEvals",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *njvevals = arkls_mem->njtimes;
  return(ARKLS_SUCCESS);
}